

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools.cxx
# Opt level: O3

void build_unique(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *data,vector<unsigned_short,_std::allocator<unsigned_short>_> *uniq_refs)

{
  pointer pbVar1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var2;
  long lVar3;
  long lVar4;
  
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (uniq_refs,
             (long)(data->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(data->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5);
  lVar3 = (long)(uniq_refs->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(uniq_refs->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                _M_impl.super__Vector_impl_data._M_start >> 1;
  lVar4 = lVar3 + -1;
  if (lVar4 != 0) {
    pbVar1 = (data->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar3 = lVar3 << 5;
    do {
      _Var2 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        (pbVar1,(long)&pbVar1[-1]._M_dataplus._M_p + lVar3,
                         (long)&(data->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[-1]._M_dataplus._M_p +
                         lVar3);
      (uniq_refs->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar4] =
           (unsigned_short)((uint)((int)_Var2._M_current - (int)pbVar1) >> 5);
      lVar4 = lVar4 + -1;
      lVar3 = lVar3 + -0x20;
    } while (lVar4 != 0);
  }
  return;
}

Assistant:

static void build_unique(const std::vector<std::string>* data, std::vector<uint16_t>& uniq_refs)
{
	// FIXME: O(N^2)
	uniq_refs.resize(data->size());
	std::vector<std::string>::const_iterator it0 = data->begin(), it;
	for (size_t i = uniq_refs.size() - 1; i != 0; --i) {
		it = std::find(it0, it0 + i, (*data)[i]);
		uniq_refs[i] = uint16_t((it - it0) & UINT16_MAX);
	}
}